

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommand_a.cpp
# Opt level: O3

void setup_subcommand_a(App *app)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  App *this_00;
  Option *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011ed00;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._vptr__Sp_counted_base = (_func_int **)(this + 2);
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"subcommand_a","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"performs subcommand a","");
  this_00 = CLI::App::add_subcommand(app,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"-f,--file","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"File name","");
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_00,&local_88,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (this + 1),&local_a8);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--with-foo","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Counter","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_c8,(bool *)(this + 3),&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_f8 = (code *)0x0;
  pcStack_f0 = (code *)0x0;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_108._M_unused._M_object = operator_new(0x10);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_108._M_unused._0_8_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 1);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_108._M_unused._0_8_ + 8) = this;
  pcStack_f0 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/examples/subcom_in_files/subcommand_a.cpp:21:23)>
               ::_M_invoke;
  local_f8 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/examples/subcom_in_files/subcommand_a.cpp:21:23)>
             ::_M_manager;
  CLI::std::function<void_()>::operator=(&this_00->callback_,(function<void_()> *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return;
}

Assistant:

void setup_subcommand_a(CLI::App &app) {
    // Create the option and subcommand objects.
    auto opt = std::make_shared<SubcommandAOptions>();
    auto sub = app.add_subcommand("subcommand_a", "performs subcommand a");

    // Add options to sub, binding them to opt.
    sub->add_option("-f,--file", opt->file, "File name")->required();
    sub->add_flag("--with-foo", opt->with_foo, "Counter");

    // Set the run function as callback to be called when this subcommand is issued.
    sub->set_callback([opt]() { run_subcommand_a(*opt); });
}